

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O2

Vec_Ptr_t * Saig_ManGetRegistersToExclude(Aig_Man_t *p)

{
  ulong *puVar1;
  ulong uVar2;
  void *pvVar3;
  Vec_Ptr_t *p_00;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar7 = p->nRegs;
  if (iVar7 < 1) {
    __assert_fail("Saig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigRetMin.c"
                  ,0x1be,"Vec_Ptr_t *Saig_ManGetRegistersToExclude(Aig_Man_t *)");
  }
  for (iVar5 = 0; iVar5 < iVar7; iVar5 = iVar5 + 1) {
    pvVar3 = Vec_PtrEntry(p->vCos,p->nTruePos + iVar5);
    puVar1 = (ulong *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18);
    *puVar1 = *puVar1 | (ulong)(((uint)*(ulong *)((long)pvVar3 + 8) & 1) << 4) + 0x10;
    iVar7 = p->nRegs;
  }
  iVar5 = 0;
  for (iVar6 = 0; iVar6 < iVar7; iVar6 = iVar6 + 1) {
    pvVar3 = Vec_PtrEntry(p->vCos,p->nTruePos + iVar6);
    uVar2 = *(ulong *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18);
    uVar4 = (uint)(uVar2 >> 5) & 1;
    if ((uVar2 & 0x10) == 0) {
      uVar4 = 0;
    }
    iVar5 = iVar5 + uVar4;
    iVar7 = p->nRegs;
  }
  p_00 = Vec_PtrAlloc(100);
  if (iVar5 != 0) {
    for (iVar7 = 0; iVar7 < p->nRegs; iVar7 = iVar7 + 1) {
      pvVar3 = Vec_PtrEntry(p->vCos,p->nTruePos + iVar7);
      if ((~*(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18) & 0x30) == 0) {
        Vec_PtrPush(p_00,pvVar3);
      }
    }
    if (p_00->nSize != iVar5) {
      __assert_fail("Vec_PtrSize(vNodes) == Diffs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigRetMin.c"
                    ,0x1d6,"Vec_Ptr_t *Saig_ManGetRegistersToExclude(Aig_Man_t *)");
    }
  }
  for (iVar7 = 0; iVar7 < p->nRegs; iVar7 = iVar7 + 1) {
    pvVar3 = Vec_PtrEntry(p->vCos,p->nTruePos + iVar7);
    puVar1 = (ulong *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18);
    *puVar1 = *puVar1 & 0xffffffffffffffcf;
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Saig_ManGetRegistersToExclude( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj, * pFanin;
    int i, Diffs;
    assert( Saig_ManRegNum(p) > 0 );
    Saig_ManForEachLi( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        if ( !Aig_ObjFaninC0(pObj) )
            pFanin->fMarkA = 1;
        else
            pFanin->fMarkB = 1;
    }
    Diffs = 0;
    Saig_ManForEachLi( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        Diffs += pFanin->fMarkA && pFanin->fMarkB;
    }
    vNodes = Vec_PtrAlloc( 100 );
    if ( Diffs > 0 )
    {
        Saig_ManForEachLi( p, pObj, i )
        {
            pFanin = Aig_ObjFanin0(pObj);
            if ( pFanin->fMarkA && pFanin->fMarkB )
                Vec_PtrPush( vNodes, pObj );
        }
        assert( Vec_PtrSize(vNodes) == Diffs );
    }
    Saig_ManForEachLi( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        pFanin->fMarkA = pFanin->fMarkB = 0;
    }
    return vNodes;
}